

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall google::protobuf::FileOptions::FileOptions(FileOptions *this,FileOptions *from)

{
  InternalMetadataWithArena *this_00;
  Rep *pRVar1;
  void *pvVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  undefined3 uVar11;
  void **our_elems;
  int iVar12;
  Arena *pAVar13;
  
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__FileOptions_0067dc70;
  internal::ExtensionSet::ExtensionSet(&this->_extensions_);
  this_00 = &this->_internal_metadata_;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  *(undefined8 *)&this->_cached_size_ = 0;
  *(undefined8 *)((long)&(this->uninterpreted_option_).super_RepeatedPtrFieldBase.arena_ + 4) = 0;
  (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->uninterpreted_option_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  iVar12 = (from->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar12 != 0) {
    pRVar1 = (from->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_;
    our_elems = internal::RepeatedPtrFieldBase::InternalExtend
                          (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase,iVar12);
    internal::RepeatedPtrFieldBase::
    MergeFromInnerLoop<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption>::TypeHandler>
              (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase,our_elems,pRVar1->elements,
               iVar12,((this->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_)->
                      allocated_size -
                      (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_);
    iVar12 = iVar12 + (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
    (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ = iVar12;
    pRVar1 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_;
    if (pRVar1->allocated_size < iVar12) {
      pRVar1->allocated_size = iVar12;
    }
  }
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    internal::InternalMetadataWithArena::DoMergeFrom
              (this_00,(UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  internal::ExtensionSet::MergeFrom(&this->_extensions_,&from->_extensions_);
  (this->java_package_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  if (((from->_has_bits_).has_bits_[0] & 1) != 0) {
    pAVar13 = (Arena *)(this_00->
                       super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       ).ptr_;
    if (((ulong)pAVar13 & 1) != 0) {
      pAVar13 = *(Arena **)(((ulong)pAVar13 & 0xfffffffffffffffe) + 0x18);
    }
    internal::ArenaStringPtr::CreateInstance
              (&this->java_package_,pAVar13,(from->java_package_).ptr_);
  }
  (this->java_outer_classname_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  if (((from->_has_bits_).has_bits_[0] & 2) != 0) {
    pAVar13 = (Arena *)(this_00->
                       super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       ).ptr_;
    if (((ulong)pAVar13 & 1) != 0) {
      pAVar13 = *(Arena **)(((ulong)pAVar13 & 0xfffffffffffffffe) + 0x18);
    }
    internal::ArenaStringPtr::CreateInstance
              (&this->java_outer_classname_,pAVar13,(from->java_outer_classname_).ptr_);
  }
  (this->go_package_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  if (((from->_has_bits_).has_bits_[0] & 4) != 0) {
    pAVar13 = (Arena *)(this_00->
                       super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       ).ptr_;
    if (((ulong)pAVar13 & 1) != 0) {
      pAVar13 = *(Arena **)(((ulong)pAVar13 & 0xfffffffffffffffe) + 0x18);
    }
    internal::ArenaStringPtr::CreateInstance(&this->go_package_,pAVar13,(from->go_package_).ptr_);
  }
  (this->objc_class_prefix_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  if (((from->_has_bits_).has_bits_[0] & 8) != 0) {
    pAVar13 = (Arena *)(this_00->
                       super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       ).ptr_;
    if (((ulong)pAVar13 & 1) != 0) {
      pAVar13 = *(Arena **)(((ulong)pAVar13 & 0xfffffffffffffffe) + 0x18);
    }
    internal::ArenaStringPtr::CreateInstance
              (&this->objc_class_prefix_,pAVar13,(from->objc_class_prefix_).ptr_);
  }
  (this->csharp_namespace_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  if (((from->_has_bits_).has_bits_[0] & 0x10) != 0) {
    pAVar13 = (Arena *)(this_00->
                       super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       ).ptr_;
    if (((ulong)pAVar13 & 1) != 0) {
      pAVar13 = *(Arena **)(((ulong)pAVar13 & 0xfffffffffffffffe) + 0x18);
    }
    internal::ArenaStringPtr::CreateInstance
              (&this->csharp_namespace_,pAVar13,(from->csharp_namespace_).ptr_);
  }
  (this->swift_prefix_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  if (((from->_has_bits_).has_bits_[0] & 0x20) != 0) {
    pAVar13 = (Arena *)(this_00->
                       super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       ).ptr_;
    if (((ulong)pAVar13 & 1) != 0) {
      pAVar13 = *(Arena **)(((ulong)pAVar13 & 0xfffffffffffffffe) + 0x18);
    }
    internal::ArenaStringPtr::CreateInstance
              (&this->swift_prefix_,pAVar13,(from->swift_prefix_).ptr_);
  }
  (this->php_class_prefix_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  if (((from->_has_bits_).has_bits_[0] & 0x40) != 0) {
    pAVar13 = (Arena *)(this_00->
                       super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       ).ptr_;
    if (((ulong)pAVar13 & 1) != 0) {
      pAVar13 = *(Arena **)(((ulong)pAVar13 & 0xfffffffffffffffe) + 0x18);
    }
    internal::ArenaStringPtr::CreateInstance
              (&this->php_class_prefix_,pAVar13,(from->php_class_prefix_).ptr_);
  }
  (this->php_namespace_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  if (((from->_has_bits_).has_bits_[0] & 0x80) != 0) {
    pAVar13 = (Arena *)(this_00->
                       super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       ).ptr_;
    if (((ulong)pAVar13 & 1) != 0) {
      pAVar13 = *(Arena **)(((ulong)pAVar13 & 0xfffffffffffffffe) + 0x18);
    }
    internal::ArenaStringPtr::CreateInstance
              (&this->php_namespace_,pAVar13,(from->php_namespace_).ptr_);
  }
  (this->php_metadata_namespace_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  if (((from->_has_bits_).has_bits_[0] & 0x100) != 0) {
    pAVar13 = (Arena *)(this_00->
                       super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       ).ptr_;
    if (((ulong)pAVar13 & 1) != 0) {
      pAVar13 = *(Arena **)(((ulong)pAVar13 & 0xfffffffffffffffe) + 0x18);
    }
    internal::ArenaStringPtr::CreateInstance
              (&this->php_metadata_namespace_,pAVar13,(from->php_metadata_namespace_).ptr_);
  }
  (this->ruby_package_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  if (((from->_has_bits_).has_bits_[0] & 0x200) != 0) {
    pAVar13 = (Arena *)(this_00->
                       super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       ).ptr_;
    if (((ulong)pAVar13 & 1) != 0) {
      pAVar13 = *(Arena **)(((ulong)pAVar13 & 0xfffffffffffffffe) + 0x18);
    }
    internal::ArenaStringPtr::CreateInstance
              (&this->ruby_package_,pAVar13,(from->ruby_package_).ptr_);
  }
  bVar3 = from->java_generate_equals_and_hash_;
  bVar4 = from->java_string_check_utf8_;
  bVar5 = from->cc_generic_services_;
  bVar6 = from->java_generic_services_;
  bVar7 = from->py_generic_services_;
  bVar8 = from->php_generic_services_;
  bVar9 = from->deprecated_;
  bVar10 = from->cc_enable_arenas_;
  uVar11 = *(undefined3 *)&from->field_0xa1;
  iVar12 = from->optimize_for_;
  this->java_multiple_files_ = from->java_multiple_files_;
  this->java_generate_equals_and_hash_ = bVar3;
  this->java_string_check_utf8_ = bVar4;
  this->cc_generic_services_ = bVar5;
  this->java_generic_services_ = bVar6;
  this->py_generic_services_ = bVar7;
  this->php_generic_services_ = bVar8;
  this->deprecated_ = bVar9;
  this->cc_enable_arenas_ = bVar10;
  *(undefined3 *)&this->field_0xa1 = uVar11;
  this->optimize_for_ = iVar12;
  return;
}

Assistant:

FileOptions::FileOptions(const FileOptions& from)
  : ::PROTOBUF_NAMESPACE_ID::Message(),
      _internal_metadata_(nullptr),
      _has_bits_(from._has_bits_),
      uninterpreted_option_(from.uninterpreted_option_) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  _extensions_.MergeFrom(from._extensions_);
  java_package_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_java_package()) {
    java_package_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_java_package(),
      GetArenaNoVirtual());
  }
  java_outer_classname_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_java_outer_classname()) {
    java_outer_classname_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_java_outer_classname(),
      GetArenaNoVirtual());
  }
  go_package_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_go_package()) {
    go_package_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_go_package(),
      GetArenaNoVirtual());
  }
  objc_class_prefix_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_objc_class_prefix()) {
    objc_class_prefix_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_objc_class_prefix(),
      GetArenaNoVirtual());
  }
  csharp_namespace_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_csharp_namespace()) {
    csharp_namespace_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_csharp_namespace(),
      GetArenaNoVirtual());
  }
  swift_prefix_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_swift_prefix()) {
    swift_prefix_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_swift_prefix(),
      GetArenaNoVirtual());
  }
  php_class_prefix_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_php_class_prefix()) {
    php_class_prefix_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_php_class_prefix(),
      GetArenaNoVirtual());
  }
  php_namespace_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_php_namespace()) {
    php_namespace_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_php_namespace(),
      GetArenaNoVirtual());
  }
  php_metadata_namespace_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_php_metadata_namespace()) {
    php_metadata_namespace_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_php_metadata_namespace(),
      GetArenaNoVirtual());
  }
  ruby_package_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_ruby_package()) {
    ruby_package_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_ruby_package(),
      GetArenaNoVirtual());
  }
  ::memcpy(&java_multiple_files_, &from.java_multiple_files_,
    static_cast<size_t>(reinterpret_cast<char*>(&optimize_for_) -
    reinterpret_cast<char*>(&java_multiple_files_)) + sizeof(optimize_for_));
  // @@protoc_insertion_point(copy_constructor:google.protobuf.FileOptions)
}